

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::FillRuleTestInstance::iterate
          (TestStatus *__return_storage_ptr__,FillRuleTestInstance *this)

{
  float *pfVar1;
  int *value;
  ostringstream *poVar2;
  deUint32 width;
  FillRuleCaseType FVar3;
  uint uVar4;
  TestLog *this_00;
  int iVar5;
  long lVar6;
  long lVar7;
  ulong __n;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  int iVar8;
  ulong uVar9;
  bool bVar10;
  ulong uVar11;
  long lVar12;
  int row;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  float fVar25;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  allocator<char> local_351;
  int local_350;
  int local_34c;
  Vector<float,_2> local_348;
  Vector<float,_2> local_340;
  Vec2 center;
  Vec2 sideH;
  Surface resultImage;
  Random rnd;
  ScopedLogSection section;
  Vector<float,_2> local_258;
  Vec2 sideV;
  string local_218;
  IVec4 colorBits;
  Vec2 quad [4];
  string iterationDescription;
  
  sideV.m_data[0] = (float)(this->m_iteration + 1);
  de::toString<int>((string *)&center,(int *)&sideV);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd,
                 "Test iteration ",(string *)&center);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quad,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd," / ");
  value = &this->m_iterationCount;
  de::toString<int>((string *)&sideH,value);
  std::operator+(&iterationDescription,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)quad,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sideH);
  std::__cxx11::string::~string((string *)&sideH);
  std::__cxx11::string::~string((string *)quad);
  std::__cxx11::string::~string((string *)&rnd);
  std::__cxx11::string::~string((string *)&center);
  tcu::ScopedLogSection::ScopedLogSection
            (&section,((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                      m_testCtx->m_log,&iterationDescription,&iterationDescription);
  tcu::getTextureFormatBitDepth
            ((tcu *)&colorBits,&(this->super_BaseRenderingTestInstance).m_textureFormat);
  local_350 = 1 << (8U - (char)colorBits.m_data[0] & 0x1f);
  local_34c = 1 << (8U - (char)colorBits.m_data[1] & 0x1f);
  iVar13 = 1 << (8U - (char)colorBits.m_data[2] & 0x1f);
  width = (this->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface(&resultImage,width,width);
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  FVar3 = this->m_caseType;
  if (FVar3 < FILLRULECASE_LAST) {
    iVar5 = this->m_iteration;
    if ((0x13U >> (FVar3 & 0x1f) & 1) == 0) {
      rnd.m_rnd.x = 0x3f000000;
      fVar19 = *(float *)(&DAT_009c3630 + (ulong)(FVar3 == FILLRULECASE_CLIPPED_PARTIAL) * 4);
      if (FVar3 != FILLRULECASE_CLIPPED_PARTIAL) {
        rnd.m_rnd.x = 0;
      }
      fVar20 = ((float)iVar5 / (float)(*value + -1)) * 3.1415927 * 0.5;
      rnd.m_rnd.y = rnd.m_rnd.x;
      fVar21 = cosf(fVar20);
      quad[0].m_data[1] = sinf(fVar20);
      quad[0].m_data[0] = fVar21;
      tcu::operator*(fVar19,quad);
      sideH.m_data[1] = -center.m_data[0];
      sideH.m_data[0] = center.m_data[1];
      tcu::operator+((Vector<float,_2> *)&rnd,&center);
      tcu::operator+(&sideV,&sideH);
      tcu::operator+((Vector<float,_2> *)&rnd,&center);
      tcu::operator-((Vector<float,_2> *)&local_218,&sideH);
      tcu::operator-((Vector<float,_2> *)&rnd,&center);
      tcu::operator-(&local_340,&sideH);
      tcu::operator-((Vector<float,_2> *)&rnd,&center);
      tcu::operator+(&local_348,&sideH);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&drawBuffer,6);
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[0] = quad[0].m_data[0];
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[1] = quad[0].m_data[1];
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[2] = 0.0;
      (drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[0] = quad[1].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[1] = quad[1].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[1].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[0] = quad[2].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[1] = quad[2].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[2].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[0] = quad[2].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[1] = quad[2].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[3].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[0] = quad[0].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[1] = quad[0].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[4].m_data[3] = 1.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[0] = quad[3].m_data[0];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[1] = quad[3].m_data[1];
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[2] = 0.0;
      drawBuffer.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start[5].m_data[3] = 1.0;
    }
    else {
      deRandom_init(&rnd.m_rnd,0xabcd);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
                (&drawBuffer,0x60);
      iVar5 = iVar5 << 4;
      lVar15 = 0;
      lVar17 = 0;
      for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
        fVar19 = ((float)(int)lVar7 + 0.5) * 0.25;
        uVar14 = 0;
        lVar16 = lVar17;
        for (lVar12 = 0; lVar12 != 0x180; lVar12 = lVar12 + 0x60) {
          fVar20 = ((float)(int)uVar14 + 0.5) * 0.25;
          center.m_data[0] = fVar20 + fVar20 + -1.0;
          fVar20 = ((float)(iVar5 + (int)uVar14) / (float)(*value << 4)) * 3.1415927 * 0.5;
          center.m_data[1] = fVar19 + fVar19 + -1.0;
          fVar21 = cosf(fVar20);
          quad[0].m_data[1] = sinf(fVar20);
          quad[0].m_data[0] = fVar21;
          tcu::operator*(0.15,quad);
          sideV.m_data[1] = -sideH.m_data[0];
          sideV.m_data[0] = sideH.m_data[1];
          tcu::operator+(&center,&sideH);
          tcu::operator+((Vector<float,_2> *)&local_218,&sideV);
          tcu::operator+(&center,&sideH);
          tcu::operator-(&local_340,&sideV);
          tcu::operator-(&center,&sideH);
          tcu::operator-(&local_348,&sideV);
          tcu::operator-(&center,&sideH);
          tcu::operator+(&local_258,&sideV);
          FVar3 = this->m_caseType;
          if (FVar3 == FILLRULECASE_PROJECTED) {
            fVar20 = deRandom_getFloat(&rnd.m_rnd);
            fVar20 = fVar20 * 3.9 + 0.1;
            fVar21 = deRandom_getFloat(&rnd.m_rnd);
            fVar21 = fVar21 * 3.9 + 0.1;
            fVar22 = deRandom_getFloat(&rnd.m_rnd);
            fVar23 = deRandom_getFloat(&rnd.m_rnd);
            fVar25 = fVar22 * 3.9 + 0.1;
            fVar22 = fVar23 * 3.9 + 0.1;
            *(ulong *)((long)(drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + lVar15)
                 = CONCAT44(quad[0].m_data[1] * fVar20,quad[0].m_data[0] * fVar20);
            *(undefined4 *)
             ((long)(drawBuffer.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar12 + 8 + lVar15) = 0;
            *(float *)((long)(drawBuffer.
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_data +
                      lVar12 + 0xc + lVar15) = fVar20;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar15 + lVar12)
                 = CONCAT44(fVar21 * quad[1].m_data[1],fVar21 * quad[1].m_data[0]);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].m_data + lVar12 + lVar15 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                      lVar12 + lVar15 + 0xc) = fVar21;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar15 + lVar12)
                 = CONCAT44(quad[2].m_data[1] * fVar25,quad[2].m_data[0] * fVar25);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[2].m_data + lVar12 + lVar15 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                      lVar12 + lVar15 + 0xc) = fVar25;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar15 + lVar12)
                 = CONCAT44(quad[2].m_data[1] * fVar25,quad[2].m_data[0] * fVar25);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[3].m_data + lVar12 + lVar15 + 8) = 0;
            lVar6 = (uVar14 | lVar7 * 4) * 6;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                      lVar12 + lVar15 + 0xc) = fVar25;
            *(ulong *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar15 + lVar12)
                 = CONCAT44(quad[0].m_data[1] * fVar20,quad[0].m_data[0] * fVar20);
            *(undefined4 *)
             ((long)drawBuffer.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[4].m_data + lVar12 + lVar15 + 8) = 0;
            *(float *)((long)drawBuffer.
                             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                      lVar12 + lVar15 + 0xc) = fVar20;
            uVar24 = CONCAT44(fVar22 * quad[3].m_data[1],fVar22 * quad[3].m_data[0]);
LAB_00728780:
            *(undefined8 *)
             drawBuffer.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar6 + 5].m_data = uVar24;
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar6 + 5].m_data[2] = 0.0;
            drawBuffer.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar6 + 5].m_data[3] = fVar22;
          }
          else {
            if (FVar3 == FILLRULECASE_REVERSED) {
              lVar6 = (uVar14 | lVar7 * 4) * 6;
              pfVar1 = (float *)((long)(drawBuffer.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar12 + lVar15);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[1].m_data[0];
              pfVar1[1] = quad[1].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
LAB_007285dc:
              uVar24 = CONCAT44(quad[3].m_data[1],quad[3].m_data[0]);
              fVar22 = 1.0;
              goto LAB_00728780;
            }
            if (FVar3 == FILLRULECASE_BASIC) {
              pfVar1 = (float *)((long)(drawBuffer.
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                lVar12 + lVar15);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[1].m_data[0];
              pfVar1[1] = quad[1].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[3].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[2].m_data[0];
              pfVar1[1] = quad[2].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              pfVar1 = (float *)((long)drawBuffer.
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[4].m_data +
                                lVar15 + lVar12);
              *pfVar1 = quad[0].m_data[0];
              pfVar1[1] = quad[0].m_data[1];
              pfVar1[2] = 0.0;
              pfVar1[3] = 1.0;
              lVar6 = lVar16;
              goto LAB_007285dc;
            }
          }
          uVar14 = uVar14 + 1;
          lVar16 = lVar16 + 6;
        }
        lVar17 = lVar17 + 0x18;
        lVar15 = lVar15 + 0x180;
        iVar5 = iVar5 + 4;
      }
    }
  }
  quad[0].m_data[0] = 0.5;
  quad[0].m_data[1] = 0.5;
  quad[1].m_data[0] = 0.5;
  quad[1].m_data[1] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd,
             (long)drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)drawBuffer.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,(value_type *)quad,
             (allocator_type *)&center);
  quad[0].m_data =
       (float  [2])
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar2 = (ostringstream *)(quad + 1);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,
                  "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  BaseRenderingTestInstance::drawPrimitives
            (&this->super_BaseRenderingTestInstance,&resultImage,&drawBuffer,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd,
             VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&rnd);
  quad[0].m_data =
       (float  [2])
       ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  poVar2 = (ostringstream *)(quad + 1);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Verifying result.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  uVar14 = 0;
  uVar9 = 0;
  if (0 < resultImage.m_width) {
    uVar9 = (ulong)(uint)resultImage.m_width;
  }
  __n = (ulong)(uint)resultImage.m_height;
  if (resultImage.m_height < 1) {
    __n = uVar14;
  }
  bVar10 = false;
  for (iVar5 = 0; iVar5 != (int)__n; iVar5 = iVar5 + 1) {
    iVar8 = (int)uVar14;
    uVar11 = uVar9;
    while (bVar18 = uVar11 != 0, uVar11 = uVar11 - 1, bVar18) {
      uVar4 = *(uint *)((long)resultImage.m_pixels.m_ptr + (long)(int)uVar14 * 4);
      if (((local_350 < (int)((uVar4 & 0xff) - 0x7f)) ||
          (local_34c < (int)((uVar4 >> 8 & 0xff) - 0x7f))) ||
         (iVar13 < (int)((uVar4 >> 0x10 & 0xff) - 0x7f))) {
        bVar10 = true;
      }
      uVar14 = (ulong)((int)uVar14 + 1);
    }
    uVar14 = (ulong)(uint)(iVar8 + resultImage.m_width);
  }
  if (bVar10) {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Overlapping fragments detected, image is not valid.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    this->m_allIterationsPassed = false;
  }
  else {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"No overlapping fragments detected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
  }
  if (this->m_caseType == FILLRULECASE_CLIPPED_FULL) {
    quad[0].m_data =
         (float  [2])
         ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
    poVar2 = (ostringstream *)(quad + 1);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Searching missing fragments.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    uVar14 = 0;
    uVar9 = 0;
    if (0 < resultImage.m_width) {
      uVar9 = (ulong)(uint)resultImage.m_width;
    }
    __n = (ulong)(uint)resultImage.m_height;
    if (resultImage.m_height < 1) {
      __n = uVar14;
    }
    bVar10 = false;
    for (iVar5 = 0; iVar5 != (int)__n; iVar5 = iVar5 + 1) {
      iVar8 = (int)uVar14;
      uVar11 = uVar9;
      while (bVar18 = uVar11 != 0, uVar11 = uVar11 - 1, bVar18) {
        uVar4 = *(uint *)((long)resultImage.m_pixels.m_ptr + (long)(int)uVar14 * 4);
        if ((((int)(uVar4 & 0xff) <= local_350) || ((int)(uVar4 >> 8 & 0xff) <= local_34c)) ||
           ((int)(uVar4 >> 0x10 & 0xff) <= iVar13)) {
          bVar10 = true;
        }
        uVar14 = (ulong)((int)uVar14 + 1);
      }
      uVar14 = (ulong)(uint)(iVar8 + resultImage.m_width);
    }
    if (bVar10) {
      quad[0].m_data =
           (float  [2])
           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(quad + 1);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"Missing fragments detected, image is not valid.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
      this->m_allIterationsPassed = false;
    }
    else {
      quad[0].m_data =
           (float  [2])
           ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
      poVar2 = (ostringstream *)(quad + 1);
      std::__cxx11::ostringstream::ostringstream(poVar2);
      std::operator<<((ostream *)poVar2,"No missing fragments detected.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)quad,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar2);
    }
  }
  this_00 = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&center,"Result of rendering",(allocator<char> *)&local_340);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sideH,"Result of rendering",(allocator<char> *)&local_348);
  tcu::LogImageSet::LogImageSet((LogImageSet *)&rnd,(string *)&center,(string *)&sideH);
  iVar13 = (int)this_00;
  tcu::LogImageSet::write((LogImageSet *)&rnd,iVar13,__buf,__n);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sideV,"Result",(allocator<char> *)&local_258);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"Result",&local_351);
  surface = &resultImage;
  tcu::LogImage::LogImage
            ((LogImage *)quad,(string *)&sideV,&local_218,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)quad,iVar13,__buf_00,(size_t)surface);
  tcu::TestLog::endImageSet(this_00);
  tcu::LogImage::~LogImage((LogImage *)quad);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&sideV);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)&rnd);
  std::__cxx11::string::~string((string *)&sideH);
  std::__cxx11::string::~string((string *)&center);
  iVar13 = this->m_iteration + 1;
  this->m_iteration = iVar13;
  if (iVar13 == this->m_iterationCount) {
    if (this->m_allIterationsPassed == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)quad,"Pass",(allocator<char> *)&rnd);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)quad);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)quad,"Found invalid pixels",(allocator<char> *)&rnd);
      tcu::TestStatus::fail(__return_storage_ptr__,(string *)quad);
    }
    std::__cxx11::string::~string((string *)quad);
  }
  else {
    tcu::TestStatus::incomplete();
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&drawBuffer.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  tcu::Surface::~Surface(&resultImage);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  std::__cxx11::string::~string((string *)&iterationDescription);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus FillRuleTestInstance::iterate (void)
{
	const std::string						iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection				section					(m_context.getTestContext().getLog(), iterationDescription, iterationDescription);
	tcu::IVec4								colorBits				= tcu::getTextureFormatBitDepth(getTextureFormat());
	const int								thresholdRed			= 1 << (8 - colorBits[0]);
	const int								thresholdGreen			= 1 << (8 - colorBits[1]);
	const int								thresholdBlue			= 1 << (8 - colorBits[2]);
	tcu::Surface							resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>					drawBuffer;

	generateTriangles(m_iteration, drawBuffer);

	// draw image
	{
		const std::vector<tcu::Vec4>	colorBuffer		(drawBuffer.size(), tcu::Vec4(0.5f, 0.5f, 0.5f, 1.0f));

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Drawing gray triangles with shared edges.\nEnabling additive blending to detect overlapping fragments." << tcu::TestLog::EndMessage;

		drawPrimitives(resultImage, drawBuffer, colorBuffer, VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST);
	}

	// verify no overdraw
	{
		const tcu::RGBA	triangleColor	= tcu::RGBA(127, 127, 127, 255);
		bool			overdraw		= false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Verifying result." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// color values are greater than triangle color? Allow lower values for multisampled edges and background.
			if ((color.getRed()   - triangleColor.getRed())   > thresholdRed   ||
				(color.getGreen() - triangleColor.getGreen()) > thresholdGreen ||
				(color.getBlue()  - triangleColor.getBlue())  > thresholdBlue)
				overdraw = true;
		}

		// results
		if (!overdraw)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No overlapping fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Overlapping fragments detected, image is not valid." << tcu::TestLog::EndMessage;
			m_allIterationsPassed = false;
		}
	}

	// verify no missing fragments in the full viewport case
	if (m_caseType == FILLRULECASE_CLIPPED_FULL)
	{
		bool missingFragments = false;

		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Searching missing fragments." << tcu::TestLog::EndMessage;

		for (int y = 0; y < resultImage.getHeight(); ++y)
		for (int x = 0; x < resultImage.getWidth();  ++x)
		{
			const tcu::RGBA color = resultImage.getPixel(x, y);

			// black? (background)
			if (color.getRed()   <= thresholdRed   ||
				color.getGreen() <= thresholdGreen ||
				color.getBlue()  <= thresholdBlue)
				missingFragments = true;
		}

		// results
		if (!missingFragments)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "No missing fragments detected." << tcu::TestLog::EndMessage;
		else
		{
			m_context.getTestContext().getLog()	<< tcu::TestLog::Message << "Missing fragments detected, image is not valid." << tcu::TestLog::EndMessage;

			m_allIterationsPassed = false;
		}
	}

	m_context.getTestContext().getLog()	<< tcu::TestLog::ImageSet("Result of rendering", "Result of rendering")
										<< tcu::TestLog::Image("Result", "Result", resultImage)
										<< tcu::TestLog::EndImageSet;

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixels");
	}
	else
		return tcu::TestStatus::incomplete();
}